

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::TimeScaleDirectiveSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,TimeScaleDirectiveSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  size_t index_local;
  TimeScaleDirectiveSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->super_DirectiveSyntax).directive.kind;
    token._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    token.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    token.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    token.info = (this->super_DirectiveSyntax).directive.info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->timeUnit).kind;
    token_00._2_1_ = (this->timeUnit).field_0x2;
    token_00.numFlags.raw = (this->timeUnit).numFlags.raw;
    token_00.rawLen = (this->timeUnit).rawLen;
    token_00.info = (this->timeUnit).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->slash).kind;
    token_01._2_1_ = (this->slash).field_0x2;
    token_01.numFlags.raw = (this->slash).numFlags.raw;
    token_01.rawLen = (this->slash).rawLen;
    token_01.info = (this->slash).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    token_02.kind = (this->timePrecision).kind;
    token_02._2_1_ = (this->timePrecision).field_0x2;
    token_02.numFlags.raw = (this->timePrecision).numFlags.raw;
    token_02.rawLen = (this->timePrecision).rawLen;
    token_02.info = (this->timePrecision).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax TimeScaleDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return timeUnit;
        case 2: return slash;
        case 3: return timePrecision;
        default: return nullptr;
    }
}